

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Base64.cpp
# Opt level: O0

string * __thiscall
Vault::Base64::encode_abi_cxx11_
          (string *__return_storage_ptr__,Base64 *this,uchar *bytes_to_encode,uint in_len)

{
  bool bVar1;
  long lVar2;
  char *pcVar3;
  int iVar4;
  Base64 *pBVar5;
  undefined1 local_67;
  char local_66;
  char local_65;
  byte local_64;
  Base64 local_63;
  byte local_62;
  byte local_61;
  undefined1 uStack_60;
  uchar char_array_4 [4];
  uchar char_array_3 [3];
  int j;
  int i;
  allocator<char> local_41;
  string local_40 [8];
  string base64_chars;
  Base64 *pBStack_18;
  uint in_len_local;
  uchar *bytes_to_encode_local;
  string *ret;
  
  base64_chars.field_2._12_4_ = SUB84(bytes_to_encode,0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_40,"ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/",&local_41);
  std::allocator<char>::~allocator(&local_41);
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  stack0xffffffffffffffa4 = 0;
  _uStack_60 = 0;
  memset(&local_63,0,3);
  memset(&local_67,0,4);
  pBStack_18 = this;
  while (iVar4 = base64_chars.field_2._12_4_ + -1, base64_chars.field_2._12_4_ != 0) {
    pBVar5 = pBStack_18 + 1;
    lVar2 = (long)stack0xffffffffffffffa4;
    unique0x100001b5 = stack0xffffffffffffffa4 + 1;
    base64_chars.field_2._12_4_ = iVar4;
    (&local_63)[lVar2] = *pBStack_18;
    pBStack_18 = pBVar5;
    if (stack0xffffffffffffffa4 == 3) {
      local_67 = (undefined1)((int)((byte)local_63 & 0xfc) >> 2);
      local_66 = ((byte)local_63 & 3) * '\x10' + (char)((int)(local_62 & 0xf0) >> 4);
      local_65 = (local_62 & 0xf) * '\x04' + (char)((int)(local_61 & 0xc0) >> 6);
      local_64 = local_61 & 0x3f;
      for (stack0xffffffffffffffa4 = 0; stack0xffffffffffffffa4 < 4;
          register0x00000000 = stack0xffffffffffffffa4 + 1) {
        pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
        std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar3);
      }
      stack0xffffffffffffffa4 = 0;
    }
  }
  base64_chars.field_2._12_4_ = iVar4;
  if (stack0xffffffffffffffa4 != 0) {
    for (_uStack_60 = stack0xffffffffffffffa4; _uStack_60 < 3; _uStack_60 = _uStack_60 + 1) {
      (&local_63)[_uStack_60] = (Base64)0x0;
    }
    local_67 = (undefined1)((int)((byte)local_63 & 0xfc) >> 2);
    local_66 = ((byte)local_63 & 3) * '\x10' + (char)((int)(local_62 & 0xf0) >> 4);
    local_65 = (local_62 & 0xf) * '\x04' + (char)((int)(local_61 & 0xc0) >> 6);
    local_64 = local_61 & 0x3f;
    for (_uStack_60 = 0; _uStack_60 < stack0xffffffffffffffa4 + 1; _uStack_60 = _uStack_60 + 1) {
      pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_40);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar3);
    }
    while (iVar4 = stack0xffffffffffffffa4 + 1, bVar1 = stack0xffffffffffffffa4 < 3,
          unique0x100001bd = iVar4, bVar1) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,'=');
    }
  }
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string Vault::Base64::encode(unsigned char const *bytes_to_encode,
                                  unsigned int in_len) {
  std::string base64_chars =
      "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/";
  std::string ret;
  int i = 0;
  int j = 0;
  unsigned char char_array_3[3] = {0};
  unsigned char char_array_4[4] = {0};

  while (in_len--) {
    char_array_3[i++] = *(bytes_to_encode++);
    if (i == 3) {
      char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
      char_array_4[1] =
          ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
      char_array_4[2] =
          ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
      char_array_4[3] = char_array_3[2] & 0x3f;

      for (i = 0; (i < 4); i++) {
        ret += base64_chars[char_array_4[i]];
      }

      i = 0;
    }
  }

  if (i) {
    for (j = i; j < 3; j++) {
      char_array_3[j] = '\0';
    }

    char_array_4[0] = (char_array_3[0] & 0xfc) >> 2;
    char_array_4[1] =
        ((char_array_3[0] & 0x03) << 4) + ((char_array_3[1] & 0xf0) >> 4);
    char_array_4[2] =
        ((char_array_3[1] & 0x0f) << 2) + ((char_array_3[2] & 0xc0) >> 6);
    char_array_4[3] = char_array_3[2] & 0x3f;

    for (j = 0; (j < i + 1); j++) {
      ret += base64_chars[char_array_4[j]];
    }

    while ((i++ < 3)) {
      ret += '=';
    }
  }

  return ret;
}